

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O3

void __thiscall
primesieve::EratBig::storeSievingPrime
          (EratBig *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  byte bVar1;
  uint64_t uVar2;
  SievingPrime **ppSVar3;
  SievingPrime *pSVar4;
  SievingPrime **ppSVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar1 = (byte)this->log2SieveSize_;
  uVar8 = multipleIndex >> (bVar1 & 0x3f);
  uVar7 = (~(-1L << (bVar1 & 0x3f)) + (prime / 0x1e) * 10 + 10 >> (bVar1 & 0x3f)) + 1;
  uVar2 = this->moduloSieveSize_;
  ppSVar5 = (this->buckets_).end_;
  ppSVar3 = (this->buckets_).array_;
  if ((ulong)((long)ppSVar5 - (long)ppSVar3 >> 3) < uVar7) {
    do {
      if (ppSVar5 == (this->buckets_).capacity_) {
        lVar6 = (long)ppSVar5 - (long)ppSVar3 >> 2;
        Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
        reserve_unchecked(&this->buckets_,lVar6 + (ulong)(lVar6 == 0));
        ppSVar5 = (this->buckets_).end_;
      }
      *ppSVar5 = (SievingPrime *)0x0;
      ppSVar3 = (this->buckets_).array_;
      ppSVar5 = (this->buckets_).end_ + 1;
      (this->buckets_).end_ = ppSVar5;
    } while ((ulong)((long)ppSVar5 - (long)ppSVar3 >> 3) < uVar7);
  }
  pSVar4 = ppSVar3[uVar8];
  if (((ulong)pSVar4 & 0x1fff) == 0) {
    MemoryPool::addBucket(this->memoryPool_,ppSVar3 + uVar8);
    ppSVar3 = (this->buckets_).array_;
    pSVar4 = ppSVar3[uVar8];
  }
  ppSVar3[uVar8] = pSVar4 + 1;
  pSVar4->indexes_ = (int)wheelIndex << 0x17 | (uint)uVar2 & (uint)multipleIndex;
  pSVar4->sievingPrime_ = (uint32_t)(prime / 0x1e);
  return;
}

Assistant:

void EratBig::storeSievingPrime(uint64_t prime,
                                uint64_t multipleIndex,
                                uint64_t wheelIndex)
{
  uint64_t sieveSize = 1ull << log2SieveSize_;
  uint64_t sievingPrime = prime / 30;
  uint64_t maxNextMultiple = sievingPrime * getMaxFactor() + getMaxFactor();
  uint64_t maxMultipleIndex = sieveSize - 1 + maxNextMultiple;
  uint64_t maxSegmentIndex = maxMultipleIndex >> log2SieveSize_;
  uint64_t newSize = maxSegmentIndex + 1;
  uint64_t segment = multipleIndex >> log2SieveSize_;
  multipleIndex &= moduloSieveSize_;

  while (buckets_.size() < newSize)
    buckets_.push_back(nullptr);

  ASSERT(prime <= maxPrime_);
  ASSERT(segment < buckets_.size());

  if (Bucket::isFull(buckets_[segment]))
    memoryPool_->addBucket(buckets_[segment]);

  buckets_[segment]++->set(sievingPrime, multipleIndex, wheelIndex);
}